

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

int NULLCTypeInfo::IsPointer(int id)

{
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x97,"int NULLCTypeInfo::IsPointer(int)");
  }
  if ((uint)id < *(uint *)(linker + 0x20c)) {
    return (int)(*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)(uint)id * 0x50) == 2);
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

int IsPointer(int id)
	{
		assert(linker);
		return linker->exTypes[id].subCat == ExternTypeInfo::CAT_POINTER;
	}